

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O2

TimingControl *
slang::ast::EventListControl::fromSyntax
          (Compilation *compilation,SyntaxNode *syntax,ASTContext *context)

{
  long lVar1;
  undefined4 extraout_var;
  EventListControl *pEVar2;
  long lVar3;
  EVP_PKEY_CTX *src;
  EventListControl *ctx;
  long lVar4;
  __extent_storage<18446744073709551615UL> unaff_R15;
  SmallVector<slang::ast::TimingControl_*,_5UL> events;
  EventListControl local_88;
  SourceRange local_38;
  
  ctx = &local_88;
  local_88.super_TimingControl.sourceRange.startLoc = (SourceLocation)&local_88.events._M_extent;
  local_88.super_TimingControl.sourceRange.endLoc = (SourceLocation)0x0;
  local_88.events._M_ptr = (pointer)0x5;
  pEVar2 = (EventListControl *)syntax;
  collectEvents(context,syntax,
                (SmallVectorBase<slang::ast::TimingControl_*> *)
                &local_88.super_TimingControl.sourceRange);
  if (local_88.super_TimingControl.sourceRange.endLoc == (SourceLocation)0x1) {
    ctx = pEVar2;
    unaff_R15._M_extent_value = *(size_t *)local_88.super_TimingControl.sourceRange.startLoc;
  }
  else {
    local_88.super_TimingControl.kind =
         SmallVectorBase<slang::ast::TimingControl_*>::copy
                   ((SmallVectorBase<slang::ast::TimingControl_*> *)
                    &local_88.super_TimingControl.sourceRange,(EVP_PKEY_CTX *)compilation,src);
    local_88.super_TimingControl._4_4_ = extraout_var;
    local_38 = slang::syntax::SyntaxNode::sourceRange(syntax);
    pEVar2 = BumpAllocator::
             emplace<slang::ast::EventListControl,std::span<slang::ast::TimingControl_const*const,18446744073709551615ul>,slang::SourceRange>
                       (&compilation->super_BumpAllocator,
                        (span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> *)
                        &local_88,&local_38);
    lVar4 = (long)local_88.super_TimingControl.sourceRange.endLoc << 3;
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar4 == lVar3) goto LAB_00300caf;
      lVar1 = lVar3 + 8;
    } while (**(int **)((long)local_88.super_TimingControl.sourceRange.startLoc + lVar3) != 0);
    ctx = pEVar2;
    unaff_R15._M_extent_value =
         (size_t)TimingControl::badCtrl(compilation,&pEVar2->super_TimingControl);
LAB_00300caf:
    if (lVar4 == lVar3) {
      unaff_R15._M_extent_value = (size_t)pEVar2;
    }
  }
  SmallVectorBase<slang::ast::TimingControl_*>::cleanup
            ((SmallVectorBase<slang::ast::TimingControl_*> *)
             &local_88.super_TimingControl.sourceRange,(EVP_PKEY_CTX *)ctx);
  return &((EventListControl *)unaff_R15._M_extent_value)->super_TimingControl;
}

Assistant:

TimingControl& EventListControl::fromSyntax(Compilation& compilation, const SyntaxNode& syntax,
                                            const ASTContext& context) {
    SmallVector<TimingControl*> events;
    collectEvents(context, syntax, events);

    if (events.size() == 1)
        return *events[0];

    auto result = compilation.emplace<EventListControl>(events.ccopy(compilation),
                                                        syntax.sourceRange());
    for (auto ev : events) {
        if (ev->bad())
            return badCtrl(compilation, result);
    }

    return *result;
}